

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int newDatabase(BtShared *pBt)

{
  MemPage *pPage;
  u8 *puVar1;
  int rc;
  uchar *data;
  MemPage *pP1;
  BtShared *pBt_local;
  
  if (pBt->nPage == 0) {
    pPage = pBt->pPage1;
    puVar1 = pPage->aData;
    pBt_local._4_4_ = sqlite3PagerWrite(pPage->pDbPage);
    if (pBt_local._4_4_ == 0) {
      puVar1[0] = 'S';
      puVar1[1] = 'Q';
      puVar1[2] = 'L';
      puVar1[3] = 'i';
      puVar1[4] = 't';
      puVar1[5] = 'e';
      puVar1[6] = ' ';
      puVar1[7] = 'f';
      puVar1[8] = 'o';
      puVar1[9] = 'r';
      puVar1[10] = 'm';
      puVar1[0xb] = 'a';
      puVar1[0xc] = 't';
      puVar1[0xd] = ' ';
      puVar1[0xe] = '3';
      puVar1[0xf] = '\0';
      puVar1[0x10] = (u8)(pBt->pageSize >> 8);
      puVar1[0x11] = (u8)(pBt->pageSize >> 0x10);
      puVar1[0x12] = '\x01';
      puVar1[0x13] = '\x01';
      puVar1[0x14] = (char)pBt->pageSize - (char)pBt->usableSize;
      puVar1[0x15] = '@';
      puVar1[0x16] = ' ';
      puVar1[0x17] = ' ';
      memset(puVar1 + 0x18,0,0x4c);
      zeroPage(pPage,0xd);
      pBt->btsFlags = pBt->btsFlags | 2;
      sqlite3Put4byte(puVar1 + 0x34,(uint)pBt->autoVacuum);
      sqlite3Put4byte(puVar1 + 0x40,(uint)pBt->incrVacuum);
      pBt->nPage = 1;
      puVar1[0x1f] = '\x01';
      pBt_local._4_4_ = 0;
    }
  }
  else {
    pBt_local._4_4_ = 0;
  }
  return pBt_local._4_4_;
}

Assistant:

static int newDatabase(BtShared *pBt){
  MemPage *pP1;
  unsigned char *data;
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->nPage>0 ){
    return SQLITE_OK;
  }
  pP1 = pBt->pPage1;
  assert( pP1!=0 );
  data = pP1->aData;
  rc = sqlite3PagerWrite(pP1->pDbPage);
  if( rc ) return rc;
  memcpy(data, zMagicHeader, sizeof(zMagicHeader));
  assert( sizeof(zMagicHeader)==16 );
  data[16] = (u8)((pBt->pageSize>>8)&0xff);
  data[17] = (u8)((pBt->pageSize>>16)&0xff);
  data[18] = 1;
  data[19] = 1;
  assert( pBt->usableSize<=pBt->pageSize && pBt->usableSize+255>=pBt->pageSize);
  data[20] = (u8)(pBt->pageSize - pBt->usableSize);
  data[21] = 64;
  data[22] = 32;
  data[23] = 32;
  memset(&data[24], 0, 100-24);
  zeroPage(pP1, PTF_INTKEY|PTF_LEAF|PTF_LEAFDATA );
  pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
  assert( pBt->autoVacuum==1 || pBt->autoVacuum==0 );
  assert( pBt->incrVacuum==1 || pBt->incrVacuum==0 );
  put4byte(&data[36 + 4*4], pBt->autoVacuum);
  put4byte(&data[36 + 7*4], pBt->incrVacuum);
#endif
  pBt->nPage = 1;
  data[31] = 1;
  return SQLITE_OK;
}